

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O2

Node * __thiscall SQASTReader::readNode(SQASTReader *this,TreeOp op)

{
  BinExpr *pBVar1;
  UnExpr *pUVar2;
  DestructuringDecl *pDVar3;
  DeclExpr *pDVar4;
  ArrayExpr *pAVar5;
  FunctionDecl *pFVar6;
  IncExpr *pIVar7;
  TableDecl *pTVar8;
  ExprStatement *pEVar9;
  TryStatement *pTVar10;
  ContinueStatement *pCVar11;
  WhileStatement *pWVar12;
  ForeachStatement *pFVar13;
  BreakStatement *pBVar14;
  Block *pBVar15;
  IfStatement *pIVar16;
  SwitchStatement *pSVar17;
  LiteralExpr *pLVar18;
  ReturnStatement *pRVar19;
  DirectiveStmt *pDVar20;
  DoWhileStatement *pDVar21;
  ForStatement *pFVar22;
  CommaExpr *pCVar23;
  ClassDecl *pCVar24;
  Id *pIVar25;
  CallExpr *pCVar26;
  DeclGroup *pDVar27;
  EnumDecl *pEVar28;
  GetFieldExpr *pGVar29;
  Node *pNVar30;
  TerExpr *pTVar31;
  ValueDecl *pVVar32;
  ConstDecl *pCVar33;
  
  switch(op) {
  case TO_BLOCK:
    pBVar15 = readBlock(this,false);
    return (Node *)pBVar15;
  case TO_IF:
    pIVar16 = readIfStatement(this);
    return (Node *)pIVar16;
  case TO_WHILE:
    pWVar12 = readWhileStatement(this);
    return (Node *)pWVar12;
  case TO_DOWHILE:
    pDVar21 = readDoWhileStatement(this);
    return (Node *)pDVar21;
  case TO_FOR:
    pFVar22 = readForStatement(this);
    return (Node *)pFVar22;
  case TO_FOREACH:
    pFVar13 = readForeachStatement(this);
    return (Node *)pFVar13;
  case TO_SWITCH:
    pSVar17 = readSwitchStatement(this);
    return (Node *)pSVar17;
  case TO_RETURN:
    pRVar19 = readReturnStatement(this);
    return (Node *)pRVar19;
  case TO_YIELD:
    pNVar30 = (Node *)readYieldStatement(this);
    return pNVar30;
  case TO_THROW:
    pNVar30 = (Node *)readThrowStatement(this);
    return pNVar30;
  case TO_TRY:
    pTVar10 = readTryStatement(this);
    return (Node *)pTVar10;
  case TO_BREAK:
    pBVar14 = readBreakStatement(this);
    return (Node *)pBVar14;
  case TO_CONTINUE:
    pCVar11 = readContinueStatement(this);
    return (Node *)pCVar11;
  case TO_EXPR_STMT:
    pEVar9 = readExprStatement(this);
    return (Node *)pEVar9;
  case TO_EMPTY:
    pNVar30 = (Node *)newNode<SQCompilation::EmptyStatement>(this);
    return pNVar30;
  case TO_DIRECTIVE:
    pDVar20 = readDirectiveStmt(this);
    return (Node *)pDVar20;
  default:
    return (Node *)0x0;
  case TO_ID:
    pIVar25 = readId(this);
    return (Node *)pIVar25;
  case TO_COMMA:
    pCVar23 = readCommaExpr(this);
    return (Node *)pCVar23;
  case TO_NULLC:
  case TO_ASSIGN:
  case TO_OROR:
  case TO_ANDAND:
  case TO_OR:
  case TO_XOR:
  case TO_AND:
  case TO_NE:
  case TO_EQ:
  case TO_3CMP:
  case TO_GE:
  case TO_GT:
  case TO_LE:
  case TO_LT:
  case TO_IN:
  case TO_INSTANCEOF:
  case TO_USHR:
  case TO_SHR:
  case TO_SHL:
  case TO_MUL:
  case TO_DIV:
  case TO_MOD:
  case TO_ADD:
  case TO_SUB:
  case TO_NEWSLOT:
  case TO_PLUSEQ:
  case TO_MINUSEQ:
  case TO_MULEQ:
  case TO_DIVEQ:
  case TO_MODEQ:
    pBVar1 = readBinExpr(this,op);
    return (Node *)pBVar1;
  case TO_NOT:
  case TO_BNOT:
  case TO_NEG:
  case TO_TYPEOF:
  case TO_RESUME:
  case TO_CLONE:
  case TO_PAREN:
  case TO_DELETE:
    pUVar2 = readUnaryExpr(this,op);
    return (Node *)pUVar2;
  case TO_LITERAL:
    pLVar18 = readLiteral(this);
    return (Node *)pLVar18;
  case TO_BASE:
    pNVar30 = (Node *)newNode<SQCompilation::BaseExpr>(this);
    return pNVar30;
  case TO_ROOT_TABLE_ACCESS:
    pNVar30 = (Node *)newNode<SQCompilation::RootTableAccessExpr>(this);
    return pNVar30;
  case TO_INC:
    pIVar7 = readIncExpr(this);
    return (Node *)pIVar7;
  case TO_DECL_EXPR:
    pDVar4 = readDeclExpr(this);
    return (Node *)pDVar4;
  case TO_ARRAYEXPR:
    pAVar5 = readArrayExpr(this);
    return (Node *)pAVar5;
  case TO_GETFIELD:
    pGVar29 = readGetFieldExpr(this);
    return (Node *)pGVar29;
  case TO_GETSLOT:
    pNVar30 = (Node *)readGetSlotExpr(this);
    return pNVar30;
  case TO_CALL:
    pCVar26 = readCallExpr(this);
    return (Node *)pCVar26;
  case TO_TERNARY:
    pTVar31 = readTernaryExpr(this);
    return (Node *)pTVar31;
  case TO_VAR:
    pVVar32 = readValueDecl(this,true);
    return (Node *)pVVar32;
  case TO_PARAM:
    pVVar32 = readValueDecl(this,false);
    return (Node *)pVVar32;
  case TO_CONST:
    pCVar33 = readConstDecl(this);
    return (Node *)pCVar33;
  case TO_DECL_GROUP:
    pDVar27 = readDeclGroup(this);
    return (Node *)pDVar27;
  case TO_DESTRUCTURE:
    pDVar3 = readDestructuringDecl(this);
    return (Node *)pDVar3;
  case TO_FUNCTION:
    pFVar6 = readFunctionDecl(this,false);
    return (Node *)pFVar6;
  case TO_CONSTRUCTOR:
    pFVar6 = readFunctionDecl(this,true);
    return (Node *)pFVar6;
  case TO_CLASS:
    pCVar24 = readClassDecl(this);
    return (Node *)pCVar24;
  case TO_ENUM:
    pEVar28 = readEnumDecl(this);
    return (Node *)pEVar28;
  case TO_TABLE:
    pTVar8 = readTableDecl(this);
    return (Node *)pTVar8;
  }
}

Assistant:

Node *SQASTReader::readNode(enum TreeOp op) {
  switch (op)
  {
  case TO_BLOCK: return readBlock(false);
  case TO_IF: return readIfStatement();
  case TO_WHILE: return readWhileStatement();
  case TO_DOWHILE: return readDoWhileStatement();
  case TO_FOR: return readForStatement();
  case TO_FOREACH: return readForeachStatement();
  case TO_SWITCH: return readSwitchStatement();
  case TO_RETURN: return readReturnStatement();
  case TO_YIELD: return readYieldStatement();
  case TO_THROW: return readThrowStatement();
  case TO_TRY: return readTryStatement();
  case TO_BREAK: return readBreakStatement();
  case TO_CONTINUE: return readContinueStatement();
  case TO_EXPR_STMT: return readExprStatement();
  case TO_EMPTY: return readEmptyStatement();
  // case TO_STATEMENT_MARK:
  case TO_ID: return readId();
  case TO_COMMA: return readCommaExpr();
  case TO_NULLC:
  case TO_ASSIGN:
  case TO_OROR:
  case TO_ANDAND:
  case TO_OR:
  case TO_XOR:
  case TO_AND:
  case TO_NE:
  case TO_EQ:
  case TO_3CMP:
  case TO_GE:
  case TO_GT:
  case TO_LE:
  case TO_LT:
  case TO_IN:
  case TO_INSTANCEOF:
  case TO_USHR:
  case TO_SHR:
  case TO_SHL:
  case TO_MUL:
  case TO_DIV:
  case TO_MOD:
  case TO_ADD:
  case TO_SUB:
  case TO_NEWSLOT:
  case TO_PLUSEQ:
  case TO_MINUSEQ:
  case TO_MULEQ:
  case TO_DIVEQ:
  case TO_MODEQ:
    return readBinExpr(op);
  case TO_NOT:
  case TO_BNOT:
  case TO_NEG:
  case TO_TYPEOF:
  case TO_RESUME:
  case TO_CLONE:
  case TO_PAREN:
  case TO_DELETE:
    return readUnaryExpr(op);
  case TO_LITERAL: return readLiteral();
  case TO_BASE: return readBaseExpr();
  case TO_ROOT_TABLE_ACCESS: return readRootTableAccessExpr();
  case TO_INC: return readIncExpr();
  case TO_DECL_EXPR: return readDeclExpr();
  case TO_ARRAYEXPR: return readArrayExpr();
  case TO_GETFIELD: return readGetFieldExpr();
  case TO_GETSLOT: return readGetSlotExpr();
  case TO_CALL: return readCallExpr();
  case TO_TERNARY: return readTernaryExpr();
  // case TO_EXPR_MARK:
  case TO_VAR: return readValueDecl(true);
  case TO_PARAM: return readValueDecl(false);
  case TO_CONST: return readConstDecl();
  case TO_DECL_GROUP: return readDeclGroup();
  case TO_DESTRUCTURE: return readDestructuringDecl();
  case TO_FUNCTION: return readFunctionDecl(false);
  case TO_CONSTRUCTOR: return readFunctionDecl(true);
  case TO_CLASS: return readClassDecl();
  case TO_ENUM: return readEnumDecl();
  case TO_TABLE: return readTableDecl();
  case TO_DIRECTIVE: return readDirectiveStmt();
  default:
    assert("Unknown Tree code");
    return NULL;
  }
}